

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imap.c
# Opt level: O2

CURLcode imap_block_statemach(connectdata *conn,_Bool disconnecting)

{
  CURLcode CVar1;
  
  CVar1 = CURLE_OK;
  while (((conn->proto).imapc.state != IMAP_STOP && (CVar1 == CURLE_OK))) {
    CVar1 = Curl_pp_statemach(&(conn->proto).ftpc.pp,true,disconnecting);
  }
  return CVar1;
}

Assistant:

static CURLcode imap_block_statemach(struct connectdata *conn,
                                     bool disconnecting)
{
  CURLcode result = CURLE_OK;
  struct imap_conn *imapc = &conn->proto.imapc;

  while(imapc->state != IMAP_STOP && !result)
    result = Curl_pp_statemach(&imapc->pp, TRUE, disconnecting);

  return result;
}